

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

sexp_conflict
json_write_string(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  long lVar1;
  sexp psVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint __c;
  long lVar5;
  sexp_conflict psVar6;
  ulong uVar7;
  sexp psVar8;
  char *pcVar9;
  ulong uVar10;
  char cout [32];
  
  lVar1 = (obj->value).uvector.length;
  psVar8 = (out->value).type.setters;
  if (psVar8 == (sexp)0x0) {
    putc(0x22,(FILE *)(out->value).type.getters);
  }
  else {
    psVar2 = (out->value).type.print;
    if (psVar2 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
      *(undefined1 *)((long)&psVar2->tag + (long)&psVar8->tag) = 0x22;
    }
    else {
      sexp_buffered_write_char(ctx,0x22,out);
    }
  }
  uVar10 = 2;
  do {
    if (lVar1 * 8 + 2U <= uVar10) {
      psVar8 = (out->value).type.setters;
      if (psVar8 == (sexp)0x0) {
        putc(0x22,(FILE *)(out->value).type.getters);
      }
      else {
        psVar2 = (out->value).type.print;
        if (psVar2 < (sexp)(out->value).port.size) {
          (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
          *(undefined1 *)((long)&psVar2->tag + (long)&psVar8->tag) = 0x22;
        }
        else {
          sexp_buffered_write_char(ctx,0x22,out);
        }
      }
      return (sexp_conflict)&DAT_0000043e;
    }
    sexp_string_utf8_ref(ctx,obj,uVar10);
    uVar7 = (ulong)(int)__c;
    if (0x7e < uVar7) {
      if (uVar7 < 0x10000) {
        snprintf(cout,0x20,"\\u%04lX");
      }
      else {
        if (0xa0ffff < uVar7) {
          psVar6 = sexp_json_write_exception(ctx,self,"unable to encode string",obj);
          return psVar6;
        }
        snprintf(cout,0x20,"\\u%04lX\\u%04lX",(uVar7 >> 10) + 0xd7c0,(ulong)(__c & 0x3ff) | 0xdc00);
      }
      pcVar9 = cout;
      if ((out->value).type.setters == (sexp)0x0) {
        psVar8 = (out->value).type.getters;
        goto LAB_0010381e;
      }
      goto LAB_0010380d;
    }
    psVar8 = (out->value).type.setters;
    switch(uVar7) {
    case 8:
      if (psVar8 != (sexp)0x0) {
        pcVar9 = "\\b";
        break;
      }
      psVar8 = (out->value).type.getters;
      pcVar9 = "\\b";
LAB_0010381e:
      fputs(pcVar9,(FILE *)psVar8);
      goto LAB_00103823;
    case 9:
      if (psVar8 == (sexp)0x0) {
        psVar8 = (out->value).type.getters;
        pcVar9 = "\\t";
        goto LAB_0010381e;
      }
      pcVar9 = "\\t";
      break;
    case 10:
      if (psVar8 == (sexp)0x0) {
        psVar8 = (out->value).type.getters;
        pcVar9 = "\\n";
        goto LAB_0010381e;
      }
      pcVar9 = "\\n";
      break;
    case 0xb:
switchD_00103790_caseD_b:
      if (psVar8 == (sexp)0x0) {
        putc(__c,(FILE *)(out->value).type.getters);
      }
      else {
        psVar2 = (out->value).type.print;
        if (psVar2 < (sexp)(out->value).port.size) {
          (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
          *(char *)((long)&psVar2->tag + (long)&psVar8->tag) = (char)__c;
        }
        else {
          sexp_buffered_write_char(ctx,__c,out);
        }
      }
      goto LAB_00103823;
    case 0xc:
      if (psVar8 == (sexp)0x0) {
        psVar8 = (out->value).type.getters;
        pcVar9 = "\\f";
        goto LAB_0010381e;
      }
      pcVar9 = "\\f";
      break;
    case 0xd:
      if (psVar8 == (sexp)0x0) {
        psVar8 = (out->value).type.getters;
        pcVar9 = "\\r";
        goto LAB_0010381e;
      }
      pcVar9 = "\\r";
      break;
    default:
      if (uVar7 != 0x5c) goto switchD_00103790_caseD_b;
      if (psVar8 == (sexp)0x0) {
        psVar8 = (out->value).type.getters;
        pcVar9 = "\\\\";
        goto LAB_0010381e;
      }
      pcVar9 = "\\\\";
    }
LAB_0010380d:
    sexp_buffered_write_string(ctx,pcVar9,out);
LAB_00103823:
    auVar3._8_8_ = (long)uVar10 >> 0x3f;
    auVar3._0_8_ = uVar10 & 0xfffffffffffffffd;
    lVar5 = SUB168(auVar3 / SEXT816(8),0);
    iVar4 = sexp_utf8_initial_byte_count
                      ((((obj->value).type.cpl)->value).flonum_bits
                       [(long)&((obj->value).type.name)->value + lVar5]);
    uVar10 = (iVar4 + lVar5) * 8 + 2;
  } while( true );
}

Assistant:

sexp json_write_string(sexp ctx, sexp self, const sexp obj, sexp out) {
  char cout[32];  /* oversized to avoid snprintf warnings */
  unsigned long ch, chh, chl;
  sexp i, end = sexp_make_string_cursor(sexp_string_size(obj));

  sexp_write_char(ctx, '"', out);
  for (i = sexp_make_string_cursor(0); i < end;
       i = sexp_string_cursor_next(obj, i)) {
    ch = sexp_unbox_character(sexp_string_cursor_ref(ctx, obj, i));
    if (ch < 0x7F) {
      switch (ch) {
        case '\\':
          sexp_write_string(ctx, "\\\\", out);
          break;
        case '\b':
          sexp_write_string(ctx, "\\b", out);
          break;
        case '\f':
          sexp_write_string(ctx, "\\f", out);
          break;
        case '\n':
          sexp_write_string(ctx, "\\n", out);
          break;
        case '\r':
          sexp_write_string(ctx, "\\r", out);
          break;
        case '\t':
          sexp_write_string(ctx, "\\t", out);
          break;
        default:
          sexp_write_char(ctx, ch, out);
          break;
      }
    } else if (ch <= 0xFFFF) {
      snprintf(cout, sizeof(cout), "\\u%04lX", ch);
      sexp_write_string(ctx, cout, out);
    } else {
      // Surrogate pair
      chh = (0xD800 - (0x10000 >> 10) + ((ch) >> 10));
      chl = (0xDC00 + ((ch) & 0x3FF));
      if (chh > 0xFFFF || chl > 0xFFFF) {
        return sexp_json_write_exception(ctx, self, "unable to encode string", obj);
      }
      snprintf(cout, sizeof(cout), "\\u%04lX\\u%04lX", chh, chl);
      sexp_write_string(ctx, cout, out);
    }
  }
  sexp_write_char(ctx, '"', out);

  return SEXP_VOID;
}